

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

int xmlValidateElementContent
              (xmlValidCtxtPtr ctxt,xmlNodePtr child,xmlElementPtr elemDecl,int warn,
              xmlNodePtr parent)

{
  xmlElementContentPtr content;
  xmlChar *str1;
  int iVar1;
  xmlNodePtr pxVar2;
  xmlChar local_27b8 [8];
  char list [5000];
  xmlChar local_1428 [8];
  char expr [5000];
  xmlChar *fullname;
  xmlChar fn [50];
  xmlRegExecCtxtPtr exec;
  xmlChar *name;
  xmlElementContentPtr cont;
  xmlNodePtr cur;
  int ret;
  xmlNodePtr parent_local;
  int warn_local;
  xmlElementPtr elemDecl_local;
  xmlNodePtr child_local;
  xmlValidCtxtPtr ctxt_local;
  
  cur._4_4_ = 1;
  if (((elemDecl == (xmlElementPtr)0x0) || (parent == (xmlNodePtr)0x0)) ||
     (ctxt == (xmlValidCtxtPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    content = elemDecl->content;
    str1 = elemDecl->name;
    if (elemDecl->contModel == (xmlRegexpPtr)0x0) {
      cur._4_4_ = xmlValidBuildContentModel(ctxt,elemDecl);
    }
    if (elemDecl->contModel == (xmlRegexpPtr)0x0) {
      ctxt_local._4_4_ = -1;
    }
    else {
      iVar1 = xmlRegexpIsDeterminist(elemDecl->contModel);
      if (iVar1 == 0) {
        ctxt_local._4_4_ = -1;
      }
      else {
        ctxt->nodeMax = 0;
        ctxt->nodeNr = 0;
        ctxt->nodeTab = (xmlNodePtr *)0x0;
        register0x00000000 =
             xmlRegNewExecCtxt(elemDecl->contModel,(xmlRegExecCallbacks)0x0,(void *)0x0);
        cont = (xmlElementContentPtr)child;
        if (register0x00000000 == (xmlRegExecCtxtPtr)0x0) {
          xmlVErrMemory(ctxt);
          ctxt_local._4_4_ = -1;
        }
        else {
LAB_0017ccbc:
          if (cont != (xmlElementContentPtr)0x0) {
            switch(*(undefined4 *)&cont->name) {
            case 1:
              if ((cont[1].c2 == (_xmlElementContent *)0x0) ||
                 ((cont[1].c2)->c2 == (_xmlElementContent *)0x0)) {
                cur._4_4_ = xmlRegExecPushString
                                      (stack0xffffffffffffffa0,(xmlChar *)cont->c1,(void *)0x0);
              }
              else {
                expr._4992_8_ =
                     xmlBuildQName((xmlChar *)cont->c1,(xmlChar *)(cont[1].c2)->c2,
                                   (xmlChar *)&fullname,0x32);
                if ((xmlChar *)expr._4992_8_ == (xmlChar *)0x0) {
                  xmlVErrMemory(ctxt);
                  cur._4_4_ = -1;
                  goto LAB_0017cebe;
                }
                cur._4_4_ = xmlRegExecPushString
                                      (stack0xffffffffffffffa0,(xmlChar *)expr._4992_8_,(void *)0x0)
                ;
                if (((xmlChar **)expr._4992_8_ != &fullname) &&
                   ((_xmlElementContent *)expr._4992_8_ != cont->c1)) {
                  (*xmlFree)((void *)expr._4992_8_);
                }
              }
              break;
            default:
              break;
            case 3:
              iVar1 = xmlIsBlankNode((xmlNode *)cont);
              if (iVar1 == 0) {
                cur._4_4_ = 0;
                goto LAB_0017cebe;
              }
              break;
            case 4:
              cur._4_4_ = 0;
              goto LAB_0017cebe;
            case 5:
              if ((cont->c2 == (_xmlElementContent *)0x0) ||
                 (cont->c2->c2 == (_xmlElementContent *)0x0)) break;
              iVar1 = nodeVPush(ctxt,(xmlNodePtr)cont);
              if (-1 < iVar1) goto LAB_0017cd31;
              cur._4_4_ = -1;
              goto LAB_0017cebe;
            }
            if (cur._4_4_ == -5) {
              xmlVErrMemory(ctxt);
            }
            cont = *(xmlElementContentPtr *)(cont + 1);
            while (cont == (xmlElementContentPtr)0x0) {
              pxVar2 = nodeVPop(ctxt);
              if (pxVar2 == (xmlNodePtr)0x0) {
                cont = (xmlElementContentPtr)0x0;
                break;
              }
              cont = (xmlElementContentPtr)pxVar2->next;
            }
            goto LAB_0017ccbc;
          }
          cur._4_4_ = xmlRegExecPushString(stack0xffffffffffffffa0,(xmlChar *)0x0,(void *)0x0);
          if (cur._4_4_ == -5) {
            xmlVErrMemory(ctxt);
          }
LAB_0017cebe:
          xmlRegFreeExecCtxt(stack0xffffffffffffffa0);
          if (((warn != 0) && (cur._4_4_ != 1)) && (cur._4_4_ != -3)) {
            if (ctxt == (xmlValidCtxtPtr)0x0) {
              if (str1 == (xmlChar *)0x0) {
                xmlErrValidNode((xmlValidCtxtPtr)0x0,parent,XML_DTD_CONTENT_MODEL,
                                "Element content does not follow the DTD\n",(xmlChar *)0x0,
                                (xmlChar *)0x0,(xmlChar *)0x0);
              }
              else {
                xmlErrValidNode((xmlValidCtxtPtr)0x0,parent,XML_DTD_CONTENT_MODEL,
                                "Element %s content does not follow the DTD\n",str1,(xmlChar *)0x0,
                                (xmlChar *)0x0);
              }
            }
            else {
              local_1428[0] = '\0';
              xmlSnprintfElementContent((char *)local_1428,5000,content,1);
              local_27b8[0] = '\0';
              xmlSnprintfElements((char *)local_27b8,5000,child,1);
              if (str1 == (xmlChar *)0x0) {
                xmlErrValidNode(ctxt,parent,XML_DTD_CONTENT_MODEL,
                                "Element content does not follow the DTD, expecting %s, got %s\n",
                                local_1428,local_27b8,(xmlChar *)0x0);
              }
              else {
                xmlErrValidNode(ctxt,parent,XML_DTD_CONTENT_MODEL,
                                "Element %s content does not follow the DTD, expecting %s, got %s\n"
                                ,str1,local_1428,local_27b8);
              }
            }
            cur._4_4_ = 0;
          }
          if (cur._4_4_ == -3) {
            cur._4_4_ = 1;
          }
          ctxt->nodeMax = 0;
          ctxt->nodeNr = 0;
          if (ctxt->nodeTab != (xmlNodePtr *)0x0) {
            (*xmlFree)(ctxt->nodeTab);
            ctxt->nodeTab = (xmlNodePtr *)0x0;
          }
          ctxt_local._4_4_ = cur._4_4_;
        }
      }
    }
  }
  return ctxt_local._4_4_;
LAB_0017cd31:
  cont = cont->c2->c2;
  goto LAB_0017ccbc;
}

Assistant:

static int
xmlValidateElementContent(xmlValidCtxtPtr ctxt, xmlNodePtr child,
       xmlElementPtr elemDecl, int warn, xmlNodePtr parent) {
    int ret = 1;
#ifndef  LIBXML_REGEXP_ENABLED
    xmlNodePtr repl = NULL, last = NULL, tmp;
#endif
    xmlNodePtr cur;
    xmlElementContentPtr cont;
    const xmlChar *name;

    if ((elemDecl == NULL) || (parent == NULL) || (ctxt == NULL))
	return(-1);
    cont = elemDecl->content;
    name = elemDecl->name;

#ifdef LIBXML_REGEXP_ENABLED
    /* Build the regexp associated to the content model */
    if (elemDecl->contModel == NULL)
	ret = xmlValidBuildContentModel(ctxt, elemDecl);
    if (elemDecl->contModel == NULL) {
	return(-1);
    } else {
	xmlRegExecCtxtPtr exec;

	if (!xmlRegexpIsDeterminist(elemDecl->contModel)) {
	    return(-1);
	}
	ctxt->nodeMax = 0;
	ctxt->nodeNr = 0;
	ctxt->nodeTab = NULL;
	exec = xmlRegNewExecCtxt(elemDecl->contModel, NULL, NULL);
	if (exec == NULL) {
            xmlVErrMemory(ctxt);
            return(-1);
        }
        cur = child;
        while (cur != NULL) {
            switch (cur->type) {
                case XML_ENTITY_REF_NODE:
                    /*
                     * Push the current node to be able to roll back
                     * and process within the entity
                     */
                    if ((cur->children != NULL) &&
                        (cur->children->children != NULL)) {
                        if (nodeVPush(ctxt, cur) < 0) {
                            ret = -1;
                            goto fail;
                        }
                        cur = cur->children->children;
                        continue;
                    }
                    break;
                case XML_TEXT_NODE:
                    if (xmlIsBlankNode(cur))
                        break;
                    ret = 0;
                    goto fail;
                case XML_CDATA_SECTION_NODE:
                    /* TODO */
                    ret = 0;
                    goto fail;
                case XML_ELEMENT_NODE:
                    if ((cur->ns != NULL) && (cur->ns->prefix != NULL)) {
                        xmlChar fn[50];
                        xmlChar *fullname;

                        fullname = xmlBuildQName(cur->name,
                                                 cur->ns->prefix, fn, 50);
                        if (fullname == NULL) {
                            xmlVErrMemory(ctxt);
                            ret = -1;
                            goto fail;
                        }
                        ret = xmlRegExecPushString(exec, fullname, NULL);
                        if ((fullname != fn) && (fullname != cur->name))
                            xmlFree(fullname);
                    } else {
                        ret = xmlRegExecPushString(exec, cur->name, NULL);
                    }
                    break;
                default:
                    break;
            }
            if (ret == XML_REGEXP_OUT_OF_MEMORY)
                xmlVErrMemory(ctxt);
            /*
             * Switch to next element
             */
            cur = cur->next;
            while (cur == NULL) {
                cur = nodeVPop(ctxt);
                if (cur == NULL)
                    break;
                cur = cur->next;
            }
        }
        ret = xmlRegExecPushString(exec, NULL, NULL);
        if (ret == XML_REGEXP_OUT_OF_MEMORY)
            xmlVErrMemory(ctxt);
fail:
        xmlRegFreeExecCtxt(exec);
    }
#else  /* LIBXML_REGEXP_ENABLED */
    /*
     * Allocate the stack
     */
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    ctxt->vstateMax = 8;
#else
    ctxt->vstateMax = 1;
#endif
    ctxt->vstateTab = xmlMalloc(ctxt->vstateMax * sizeof(ctxt->vstateTab[0]));
    if (ctxt->vstateTab == NULL) {
	xmlVErrMemory(ctxt);
	return(-1);
    }
    /*
     * The first entry in the stack is reserved to the current state
     */
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    ctxt->nodeTab = NULL;
    ctxt->vstate = &ctxt->vstateTab[0];
    ctxt->vstateNr = 1;
    CONT = cont;
    NODE = child;
    DEPTH = 0;
    OCCURS = 0;
    STATE = 0;
    ret = xmlValidateElementType(ctxt);
    if ((ret == -3) && (warn)) {
	char expr[5000];
	expr[0] = 0;
	xmlSnprintfElementContent(expr, 5000, elemDecl->content, 1);
	xmlErrValidNode(ctxt, (xmlNodePtr) elemDecl,
                XML_DTD_CONTENT_NOT_DETERMINIST,
	        "Content model of %s is not deterministic: %s\n",
	        name, BAD_CAST expr, NULL);
    } else if (ret == -2) {
	/*
	 * An entities reference appeared at this level.
	 * Build a minimal representation of this node content
	 * sufficient to run the validation process on it
	 */
	cur = child;
	while (cur != NULL) {
	    switch (cur->type) {
		case XML_ENTITY_REF_NODE:
		    /*
		     * Push the current node to be able to roll back
		     * and process within the entity
		     */
		    if ((cur->children != NULL) &&
			(cur->children->children != NULL)) {
			if (nodeVPush(ctxt, cur) < 0) {
                            xmlFreeNodeList(repl);
                            ret = -1;
                            goto done;
                        }
			cur = cur->children->children;
			continue;
		    }
		    break;
		case XML_TEXT_NODE:
		    if (xmlIsBlankNode(cur))
			break;
		    /* falls through */
		case XML_CDATA_SECTION_NODE:
		case XML_ELEMENT_NODE:
		    /*
		     * Allocate a new node and minimally fills in
		     * what's required
		     */
		    tmp = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
		    if (tmp == NULL) {
			xmlVErrMemory(ctxt);
			xmlFreeNodeList(repl);
			ret = -1;
			goto done;
		    }
		    tmp->type = cur->type;
		    tmp->name = cur->name;
		    tmp->ns = cur->ns;
		    tmp->next = NULL;
		    tmp->content = NULL;
		    if (repl == NULL)
			repl = last = tmp;
		    else {
			last->next = tmp;
			last = tmp;
		    }
		    if (cur->type == XML_CDATA_SECTION_NODE) {
			/*
			 * E59 spaces in CDATA does not match the
			 * nonterminal S
			 */
			tmp->content = xmlStrdup(BAD_CAST "CDATA");
		    }
		    break;
		default:
		    break;
	    }
	    /*
	     * Switch to next element
	     */
	    cur = cur->next;
	    while (cur == NULL) {
		cur = nodeVPop(ctxt);
		if (cur == NULL)
		    break;
		cur = cur->next;
	    }
	}

	/*
	 * Relaunch the validation
	 */
	ctxt->vstate = &ctxt->vstateTab[0];
	ctxt->vstateNr = 1;
	CONT = cont;
	NODE = repl;
	DEPTH = 0;
	OCCURS = 0;
	STATE = 0;
	ret = xmlValidateElementType(ctxt);
    }
#endif /* LIBXML_REGEXP_ENABLED */
    if ((warn) && ((ret != 1) && (ret != -3))) {
	if (ctxt != NULL) {
	    char expr[5000];
	    char list[5000];

	    expr[0] = 0;
	    xmlSnprintfElementContent(&expr[0], 5000, cont, 1);
	    list[0] = 0;
#ifndef LIBXML_REGEXP_ENABLED
	    if (repl != NULL)
		xmlSnprintfElements(&list[0], 5000, repl, 1);
	    else
#endif /* LIBXML_REGEXP_ENABLED */
		xmlSnprintfElements(&list[0], 5000, child, 1);

	    if (name != NULL) {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
	   "Element %s content does not follow the DTD, expecting %s, got %s\n",
		       name, BAD_CAST expr, BAD_CAST list);
	    } else {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
	   "Element content does not follow the DTD, expecting %s, got %s\n",
		       BAD_CAST expr, BAD_CAST list, NULL);
	    }
	} else {
	    if (name != NULL) {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
		       "Element %s content does not follow the DTD\n",
		       name, NULL, NULL);
	    } else {
		xmlErrValidNode(ctxt, parent, XML_DTD_CONTENT_MODEL,
		       "Element content does not follow the DTD\n",
		                NULL, NULL, NULL);
	    }
	}
	ret = 0;
    }
    if (ret == -3)
	ret = 1;

#ifndef  LIBXML_REGEXP_ENABLED
done:
    /*
     * Deallocate the copy if done, and free up the validation stack
     */
    while (repl != NULL) {
	tmp = repl->next;
	xmlFree(repl);
	repl = tmp;
    }
    ctxt->vstateMax = 0;
    if (ctxt->vstateTab != NULL) {
	xmlFree(ctxt->vstateTab);
	ctxt->vstateTab = NULL;
    }
#endif
    ctxt->nodeMax = 0;
    ctxt->nodeNr = 0;
    if (ctxt->nodeTab != NULL) {
	xmlFree(ctxt->nodeTab);
	ctxt->nodeTab = NULL;
    }
    return(ret);

}